

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_0::anon_unknown_5::createCoordData
               (vector<float,_std::allocator<float>_> *data,TestConfig *config)

{
  iterator iVar1;
  int iVar2;
  uint uVar3;
  float fVar4;
  float local_4c;
  undefined1 local_48 [16];
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  if (config->useIndices == true) {
    iVar2 = 1;
    do {
      fVar4 = *(float *)(&DAT_0034fc30 + (ulong)(iVar2 == 1) * 4);
      local_4c = -fVar4;
      iVar1._M_current =
           (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      local_48 = ZEXT416((uint)fVar4);
      uStack_34 = 0x80000000;
      uStack_30 = 0x80000000;
      uStack_2c = 0x80000000;
      local_38 = local_4c;
      if (iVar1._M_current ==
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c);
        fVar4 = (float)local_48._0_4_;
      }
      else {
        *iVar1._M_current = local_4c;
        (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar1._M_current ==
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        local_4c = local_38;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c);
        local_4c = (float)local_48._0_4_;
      }
      else {
        *iVar1._M_current = local_38;
        (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar1._M_current + 1;
        local_4c = fVar4;
      }
      iVar1._M_current =
           (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar1._M_current ==
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c);
        local_4c = (float)local_48._0_4_;
      }
      else {
        *iVar1._M_current = local_4c;
        (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar1._M_current ==
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        local_4c = local_38;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c);
        local_4c = (float)local_48._0_4_;
      }
      else {
        *iVar1._M_current = local_38;
        (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar1._M_current ==
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c);
        local_4c = (float)local_48._0_4_;
      }
      else {
        *iVar1._M_current = local_4c;
        (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar1._M_current ==
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c);
      }
      else {
        *iVar1._M_current = local_4c;
        (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar1._M_current + 1;
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 == 0);
  }
  else {
    std::vector<float,_std::allocator<float>_>::reserve(data,(long)(config->triangleCount * 6));
    if (0 < config->triangleCount) {
      uVar3 = 0;
      do {
        fVar4 = *(float *)(&DAT_0034fc30 + (ulong)((uVar3 & 1) == 0) * 4);
        local_4c = -fVar4;
        iVar1._M_current =
             (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_48 = ZEXT416((uint)fVar4);
        uStack_34 = 0x80000000;
        uStack_30 = 0x80000000;
        uStack_2c = 0x80000000;
        local_38 = local_4c;
        if (iVar1._M_current ==
            (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c)
          ;
          fVar4 = (float)local_48._0_4_;
        }
        else {
          *iVar1._M_current = local_4c;
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_4c = local_38;
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c)
          ;
          local_4c = (float)local_48._0_4_;
        }
        else {
          *iVar1._M_current = local_38;
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
          local_4c = fVar4;
        }
        iVar1._M_current =
             (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c)
          ;
          local_4c = (float)local_48._0_4_;
        }
        else {
          *iVar1._M_current = local_4c;
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_4c = local_38;
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c)
          ;
          local_4c = (float)local_48._0_4_;
        }
        else {
          *iVar1._M_current = local_38;
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c)
          ;
          local_4c = (float)local_48._0_4_;
        }
        else {
          *iVar1._M_current = local_4c;
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(data,iVar1,&local_4c)
          ;
        }
        else {
          *iVar1._M_current = local_4c;
          (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
        uVar3 = uVar3 + 1;
      } while ((int)uVar3 < config->triangleCount);
    }
  }
  return;
}

Assistant:

void createCoordData (vector<float>& data, const TestConfig& config)
{
	if (config.useIndices)
	{
		for (int triangleNdx = 0; triangleNdx < 2; triangleNdx++)
		{
			const float x1 = -1.0f;
			const float y1 = -1.0f;

			const float x2 = 1.0f;
			const float y2 = 1.0f;

			const float side = ((triangleNdx % 2) == 0 ? 1.0f : -1.0f);

			data.push_back(side * x1);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y2);
		}
	}
	else
	{
		data.reserve(config.triangleCount * 3 * 2);

		for (int triangleNdx = 0; triangleNdx < config.triangleCount; triangleNdx++)
		{
			const float x1 = -1.0f;
			const float y1 = -1.0f;

			const float x2 = 1.0f;
			const float y2 = 1.0f;

			const float side = ((triangleNdx % 2) == 0 ? 1.0f : -1.0f);

			data.push_back(side * x1);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y2);
		}
	}
}